

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O3

void re2::SetEmptyUnanchored(void)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> v;
  Set s;
  vector<int,_std::allocator<int>_> local_1f8;
  Set local_1d8;
  LogMessage local_190;
  
  RE2::Options::Options((Options *)&local_190,DefaultOptions);
  RE2::Set::Set(&local_1d8,(Options *)&local_190,UNANCHORED);
  bVar1 = RE2::Set::Compile(&local_1d8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x7c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (s.Compile()) == (true)",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  local_190._0_8_ = "";
  local_190._8_4_ = 0;
  bVar1 = RE2::Set::Match(&local_1d8,(StringPiece *)&local_190,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x7e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (s.Match(\"\", __null)) == (false)",
               0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  local_190._0_8_ = "foobar";
  local_190._8_4_ = 6;
  bVar1 = RE2::Set::Match(&local_1d8,(StringPiece *)&local_190,
                          (vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x7f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),
               "Check failed: (s.Match(\"foobar\", __null)) == (false)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_190._0_8_ = "";
  local_190._8_4_ = 0;
  bVar1 = RE2::Set::Match(&local_1d8,(StringPiece *)&local_190,&local_1f8);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x82,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (s.Match(\"\", &v)) == (false)",0x2a
              );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x83,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (v.size()) == (0)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  local_190._0_8_ = "foobar";
  local_190._8_4_ = 6;
  bVar1 = RE2::Set::Match(&local_1d8,(StringPiece *)&local_190,&local_1f8);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x85,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),
               "Check failed: (s.Match(\"foobar\", &v)) == (false)",0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x86,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (v.size()) == (0)",0x1f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  RE2::Set::~Set(&local_1d8);
  return;
}

Assistant:

TEST(Set, EmptyUnanchored) {
  RE2::Set s(RE2::DefaultOptions, RE2::UNANCHORED);

  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("", NULL), false);
  CHECK_EQ(s.Match("foobar", NULL), false);

  vector<int> v;
  CHECK_EQ(s.Match("", &v), false);
  CHECK_EQ(v.size(), 0);

  CHECK_EQ(s.Match("foobar", &v), false);
  CHECK_EQ(v.size(), 0);
}